

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int sx_hashtbl_valid_capacity(int capacity)

{
  uint uVar1;
  int capacity_local;
  
  uVar1 = (int)(capacity - 1U) >> 1 | capacity - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  return ((int)uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

int sx_hashtbl_valid_capacity(int capacity)
{
    return sx_nearest_pow2(capacity);
}